

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogAux.h
# Opt level: O2

void Assimp::LogFunctions<Assimp::FBXImporter>::ThrowException(string *msg)

{
  DeadlyImportError *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  this = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::operator+(&bStack_38,"FBX: ",msg);
  DeadlyImportError::DeadlyImportError(this,&bStack_38);
  __cxa_throw(this,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void ThrowException(const std::string& msg)
    {
        throw DeadlyImportError(Prefix()+msg);
    }